

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signal.h
# Opt level: O2

uint __thiscall
gui::Signal<gui::Widget*,sf::String_const&>::connect<void(&)(gui::Widget*,sf::String_const&)>
          (Signal<gui::Widget*,sf::String_const&> *this,_func_void_Widget_ptr_String_ptr *func)

{
  uint uVar1;
  size_type sVar2;
  
  while( true ) {
    sVar2 = std::
            map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>_>
            ::count((map<unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_gui::Callback<gui::Widget_*,_const_sf::String_&>_>_>_>
                     *)(this + 8),&priv::signalIdCounter);
    if (sVar2 == 0) break;
    priv::signalIdCounter = priv::signalIdCounter + 1;
  }
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,gui::Callback<gui::Widget*,sf::String_const&>>,std::_Select1st<std::pair<unsigned_int_const,gui::Callback<gui::Widget*,sf::String_const&>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,gui::Callback<gui::Widget*,sf::String_const&>>>>
  ::_M_emplace_unique<unsigned_int&,void(&)(gui::Widget*,sf::String_const&)>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,gui::Callback<gui::Widget*,sf::String_const&>>,std::_Select1st<std::pair<unsigned_int_const,gui::Callback<gui::Widget*,sf::String_const&>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,gui::Callback<gui::Widget*,sf::String_const&>>>>
              *)(this + 8),&priv::signalIdCounter,func);
  uVar1 = priv::signalIdCounter;
  priv::signalIdCounter = priv::signalIdCounter + 1;
  return uVar1;
}

Assistant:

unsigned int connect(F&& func) {
        // Using perfect forwarding has the drawback of creating very long error
        // messages when types don't line up. Verify the argument type here
        // before continuing.
        static_assert(
            std::is_constructible<Callback<Targs...>, F>::value,
            "Cannot convert argument \'func\' to a Callback, check the function signature."
        );

        while (callbacks_.count(priv::signalIdCounter)) {
            ++priv::signalIdCounter;
        }
        callbacks_.emplace(priv::signalIdCounter, std::forward<F>(func));

        return priv::signalIdCounter++;
    }